

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aln_filter.cpp
# Opt level: O3

alns_t * example::filter_to_unique_cds_for_gene
                   (alns_t *__return_storage_ptr__,alns_t *alns_for_gene)

{
  seq_id_t *psVar1;
  pos_t pVar2;
  pos_t pVar3;
  int64_t iVar4;
  alns_t *paVar5;
  bool bVar6;
  pointer paVar7;
  pointer paVar8;
  ulong uVar9;
  iterator __first;
  long lVar10;
  const_iterator __position;
  const_iterator __position_00;
  ulong uVar11;
  __normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
  __seed;
  pointer paVar12;
  _Head_base<2UL,_long_&,_false> _Var13;
  __normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
  __last;
  size_type *__v;
  value_type *pvVar14;
  undefined1 local_1a8 [16];
  aln_t *local_198;
  undefined1 local_188 [16];
  pointer local_178;
  concat local_16a;
  undefined1 local_169;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_168;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  local_148;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  local_128;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_108;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  *local_f0;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_e8;
  value_type *local_d0;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_c8;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_a8;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_88;
  alns_t *local_70;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_68;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  local_48;
  
  paVar7 = (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>).
           _M_impl.super__Vector_impl_data._M_start;
  paVar12 = (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  uVar9 = (long)paVar12 - (long)paVar7;
  paVar8 = paVar7;
  uVar11 = uVar9;
  if (0 < (long)uVar9 >> 9) {
    paVar8 = (pointer)((long)&paVar7->aln_id + (uVar9 & 0xfffffffffffffe00));
    lVar10 = ((long)uVar9 >> 9) + 1;
    __first._M_current = paVar7 + 2;
    do {
      if (__first._M_current[-2].chr_cds_start_pos == 0) {
        __first._M_current = __first._M_current + -2;
        goto LAB_0011045d;
      }
      if (__first._M_current[-1].chr_cds_start_pos == 0) {
        __first._M_current = __first._M_current + -1;
        goto LAB_0011045d;
      }
      if ((__first._M_current)->chr_cds_start_pos == 0) goto LAB_0011045d;
      if (__first._M_current[1].chr_cds_start_pos == 0) {
        __first._M_current = __first._M_current + 1;
        goto LAB_0011045d;
      }
      lVar10 = lVar10 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar10);
    uVar11 = (long)paVar12 - (long)paVar8;
  }
  lVar10 = (long)uVar11 >> 7;
  if (lVar10 == 1) {
LAB_0011043c:
    __first._M_current = paVar8;
    if (paVar8->chr_cds_start_pos != 0) {
      __first._M_current = paVar12;
    }
  }
  else if (lVar10 == 2) {
LAB_00110431:
    __first._M_current = paVar8;
    if (paVar8->chr_cds_start_pos != 0) {
      paVar8 = paVar8 + 1;
      goto LAB_0011043c;
    }
  }
  else {
    __first._M_current = paVar12;
    if (lVar10 != 3) goto LAB_001104e7;
    __first._M_current = paVar8;
    if (paVar8->chr_cds_start_pos != 0) {
      paVar8 = paVar8 + 1;
      goto LAB_00110431;
    }
  }
LAB_0011045d:
  paVar8 = __first._M_current + 1;
  if (paVar8 != paVar12 && __first._M_current != paVar12) {
    do {
      if (paVar8->chr_cds_start_pos != 0) {
        (__first._M_current)->gene_id = paVar8->gene_id;
        (__first._M_current)->aln_id = paVar8->aln_id;
        std::__cxx11::string::operator=
                  ((string *)&(__first._M_current)->mrna_id,(string *)&paVar8->mrna_id);
        ((__first._M_current)->mrna_id).second = (paVar8->mrna_id).second;
        std::__cxx11::string::operator=
                  ((string *)&(__first._M_current)->chr_id,(string *)&paVar8->chr_id);
        ((__first._M_current)->chr_id).second = (paVar8->chr_id).second;
        pVar2 = paVar8->chr_start;
        pVar3 = paVar8->chr_stop;
        iVar4 = paVar8->score;
        (__first._M_current)->chr_cds_start_pos = paVar8->chr_cds_start_pos;
        (__first._M_current)->score = iVar4;
        (__first._M_current)->chr_start = pVar2;
        (__first._M_current)->chr_stop = pVar3;
        __first._M_current = __first._M_current + 1;
      }
      paVar8 = paVar8 + 1;
    } while (paVar8 != paVar12);
    paVar7 = (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar9 = (long)(alns_for_gene->
                  super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)paVar7;
  }
LAB_001104e7:
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_erase
            (alns_for_gene,__first,(aln_t *)((long)&paVar7->aln_id + uVar9));
  __seed._M_current =
       (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_178 = (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar7 = local_178;
  if (__seed._M_current != __last._M_current) {
    lVar10 = (long)__last._M_current - (long)__seed._M_current >> 7;
    local_188._0_8_ = __seed._M_current;
    local_188._8_8_ = __last._M_current;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
                         *)local_1a8,__seed,(lVar10 - (lVar10 + 1 >> 0x3f)) + 1 >> 1);
    if (local_198 == (aln_t *)0x0) {
      std::operator()(__seed,__last,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )0x0);
    }
    else {
      std::operator()(__seed,__last,local_198,local_1a8._8_8_,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_148);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
                *)local_1a8);
    __seed._M_current = (aln_t *)local_188._0_8_;
    paVar7 = local_178;
    __last._M_current = (aln_t *)local_188._8_8_;
  }
  local_188._0_8_ = (long *)0x0;
  local_188._8_8_ = (pointer)0x0;
  local_178 = (pointer)0x0;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_188);
  local_108.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<example::aln_t,_std::allocator<example::aln_t>_> *)0x0;
  local_128.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (vector<example::aln_t,_std::allocator<example::aln_t>_> *)0x0;
  local_128.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._0_8_ = __seed._M_current;
  local_188._8_8_ = __last._M_current;
  local_178 = paVar7;
  if (__seed._M_current != __last._M_current) {
    local_1a8._0_8_ = (long *)0x0;
    local_1a8._8_8_ = (pointer)0x0;
    local_198 = (aln_t *)0x0;
    std::
    vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
    ::emplace_back<std::vector<example::aln_t,std::allocator<example::aln_t>>>
              ((vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
                *)&local_128,(vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1a8);
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
              ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1a8);
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_insert_rval
              (local_128.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,
               local_128.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
               super__Vector_impl_data._M_finish,__seed._M_current);
    while (pvVar14 = __seed._M_current + 1, pvVar14 != __last._M_current) {
      __position._M_current =
           local_128.
           super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current[-1].chr_cds_start_pos != __seed._M_current[1].chr_cds_start_pos) {
        local_1a8._0_8_ = (long *)0x0;
        local_1a8._8_8_ = (pointer)0x0;
        local_198 = (aln_t *)0x0;
        std::
        vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
        ::emplace_back<std::vector<example::aln_t,std::allocator<example::aln_t>>>
                  ((vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
                    *)&local_128,
                   (vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1a8);
        std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
                  ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1a8);
        __position._M_current =
             local_128.
             super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_insert_rval
                (local_128.
                 super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,__position,pvVar14);
      __seed._M_current = pvVar14;
    }
  }
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_188);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_108);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_168);
  local_178 = (pointer)local_128.
                       super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  paVar7 = (pointer)local_128.
                    super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  _Var13._M_head_impl =
       (long *)local_128.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_128.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._0_8_ = _Var13._M_head_impl;
  local_188._8_8_ = paVar7;
  local_e8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar12 = local_178;
  if ((pointer)_Var13._M_head_impl != paVar7) {
    lVar10 = ((long)paVar7 - (long)_Var13._M_head_impl >> 3) * -0x5555555555555555;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                         *)local_1a8,
                        (__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                         )_Var13._M_head_impl,(lVar10 - (lVar10 + 1 >> 0x3f)) + 1 >> 1);
    if (local_198 == (aln_t *)0x0) {
      std::operator()((__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                       )_Var13._M_head_impl,
                      (__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                       )paVar7,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                                )0x0);
    }
    else {
      std::operator()((__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                       )_Var13._M_head_impl,
                      (__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                       )paVar7,(vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_198,
                      local_1a8._8_8_,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_88);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                *)local_1a8);
    paVar12 = local_178;
    paVar7 = (pointer)local_188._8_8_;
    _Var13._M_head_impl = (long *)local_188._0_8_;
  }
  local_188._0_8_ = (long *)0x0;
  local_188._8_8_ = (pointer)0x0;
  local_178 = (pointer)0x0;
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             *)local_188);
  local_148.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._0_8_ = _Var13._M_head_impl;
  local_188._8_8_ = paVar7;
  local_178 = paVar12;
  if ((pointer)_Var13._M_head_impl != paVar7) {
    local_1a8._0_8_ = (long *)0x0;
    local_1a8._8_8_ = (pointer)0x0;
    local_198 = (aln_t *)0x0;
    std::
    vector<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>,std::allocator<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>>
    ::
    emplace_back<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>
              ((vector<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>,std::allocator<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>>
                *)&local_168,
               (vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                *)local_1a8);
    std::
    vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
    ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               *)local_1a8);
    std::
    vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
    ::_M_insert_rval((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                      *)&local_168.
                         super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl
                         .super__Vector_impl_data._M_finish[-1].chr_stop,
                     (vector<example::aln_t,_std::allocator<example::aln_t>_> *)
                     local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].chr_cds_start_pos,
                     (value_type *)_Var13._M_head_impl);
    while (__v = &(((pointer)_Var13._M_head_impl)->mrna_id).first._M_string_length,
          (pointer)__v != paVar7) {
      __position_00._M_current =
           (vector<example::aln_t,_std::allocator<example::aln_t>_> *)
           local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].chr_cds_start_pos;
      if ((((pointer)_Var13._M_head_impl)->mrna_id).first.field_2._M_allocated_capacity - *__v !=
          (long)__position_00._M_current[-1].
                super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)__position_00._M_current[-1].
                super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
                super__Vector_impl_data._M_start) {
        local_1a8._0_8_ = (long *)0x0;
        local_1a8._8_8_ = (pointer)0x0;
        local_198 = (aln_t *)0x0;
        std::
        vector<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>,std::allocator<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>>
        ::
        emplace_back<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>
                  ((vector<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>,std::allocator<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>>
                    *)&local_168,
                   (vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                    *)local_1a8);
        std::
        vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
        ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                   *)local_1a8);
        __position_00._M_current =
             (vector<example::aln_t,_std::allocator<example::aln_t>_> *)
             local_168.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].chr_cds_start_pos;
      }
      std::
      vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
      ::_M_insert_rval((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                        *)&local_168.
                           super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish[-1].chr_stop,__position_00,
                       (value_type *)__v);
      _Var13._M_head_impl = (long *)__v;
    }
  }
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             *)local_188);
  local_1a8._0_8_ = (long *)0x1;
  local_1a8._8_8_ = (pointer)0x0;
  rangeless::fn::operators::operator%
            ((vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
              *)&local_108,
             (vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
              *)&local_168,(take_while<rangeless::fn::impl::call_count_lt> *)local_1a8);
  rangeless::fn::operators::operator%
            (&local_48,
             (vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
              *)&local_108,(concat *)local_188);
  std::
  vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
             *)&local_108);
  std::
  vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
             *)&local_168);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_148);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             *)&local_e8);
  local_f0 = &local_48;
  rangeless::fn::operators::operator%(&local_c8,local_f0,&local_16a);
  local_178 = local_c8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  pvVar14 = local_c8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
            super__Vector_impl_data._M_finish;
  _Var13._M_head_impl =
       &(local_c8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
         super__Vector_impl_data._M_start)->aln_id;
  local_c8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._0_8_ = _Var13._M_head_impl;
  local_188._8_8_ = pvVar14;
  local_88.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar7 = local_178;
  local_70 = __return_storage_ptr__;
  if ((value_type *)_Var13._M_head_impl != pvVar14) {
    lVar10 = (long)pvVar14 - (long)_Var13._M_head_impl >> 7;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
                         *)local_1a8,
                        (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                         )_Var13._M_head_impl,(lVar10 - (lVar10 + 1 >> 0x3f)) + 1 >> 1);
    if (local_198 == (aln_t *)0x0) {
      std::operator()((__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )_Var13._M_head_impl,
                      (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )pvVar14,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )0x0);
    }
    else {
      std::operator()((__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )_Var13._M_head_impl,
                      (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )pvVar14,local_198,local_1a8._8_8_,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_169);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
                *)local_1a8);
    paVar7 = local_178;
    _Var13._M_head_impl = (long *)local_188._0_8_;
    pvVar14 = (value_type *)local_188._8_8_;
  }
  local_188._0_8_ = (long *)0x0;
  local_188._8_8_ = (pointer)0x0;
  local_178 = (pointer)0x0;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_188);
  local_e8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)_Var13._M_head_impl;
  local_108.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = pvVar14;
  local_108.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = paVar7;
  if ((value_type *)_Var13._M_head_impl != pvVar14) {
    local_1a8._0_8_ = (long *)0x0;
    local_1a8._8_8_ = (pointer)0x0;
    local_198 = (aln_t *)0x0;
    std::
    vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
    ::emplace_back<std::vector<example::aln_t,std::allocator<example::aln_t>>>
              ((vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
                *)&local_148,(vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1a8);
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
              ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1a8);
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_insert_rval
              (local_148.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,
               local_148.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
               super__Vector_impl_data._M_finish,(value_type *)_Var13._M_head_impl);
    local_d0 = pvVar14;
    for (_Var13._M_head_impl = _Var13._M_head_impl + 0x1e;
        (value_type *)(_Var13._M_head_impl + -0xe) != pvVar14;
        _Var13._M_head_impl = _Var13._M_head_impl + 0x10) {
      paVar7 = local_148.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
               super__Vector_impl_data._M_finish;
      psVar1 = &paVar7[-1].chr_id;
      lVar10 = std::__cxx11::string::find((char *)psVar1,0x121403,0);
      local_1a8._0_8_ = &paVar7[-1].chr_cds_start_pos;
      local_198 = (aln_t *)CONCAT71(local_198._1_7_,lVar10 != 0);
      paVar7 = (pointer)(_Var13._M_head_impl + -7);
      local_1a8._8_8_ = psVar1;
      lVar10 = std::__cxx11::string::find((char *)paVar7,0x121403,0);
      local_178 = (pointer)CONCAT71(local_178._1_7_,lVar10 != 0);
      local_188._0_8_ = _Var13._M_head_impl;
      local_188._8_8_ = paVar7;
      if ((local_198._0_1_ != (lVar10 != 0)) ||
         (bVar6 = std::
                  __tuple_compare<std::tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>,_std::tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>,_1UL,_3UL>
                  ::__eq((tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>
                          *)local_1a8,
                         (tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>
                          *)local_188), pvVar14 = local_d0, !bVar6)) {
        pvVar14 = local_d0;
        local_1a8._0_8_ = (long *)0x0;
        local_1a8._8_8_ = (pointer)0x0;
        local_198 = (aln_t *)0x0;
        std::
        vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
        ::emplace_back<std::vector<example::aln_t,std::allocator<example::aln_t>>>
                  ((vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
                    *)&local_148,
                   (vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1a8);
        std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
                  ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1a8);
      }
      std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_insert_rval
                (local_148.
                 super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,
                 local_148.
                 super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
                 super__Vector_impl_data._M_finish,(value_type *)(_Var13._M_head_impl + -0xe));
    }
  }
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_108);
  local_1a8._0_8_ = (long *)0x1;
  local_1a8._8_8_ = (pointer)0x0;
  rangeless::fn::operators::operator%
            ((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
              *)&local_168,&local_148,(take_while<rangeless::fn::impl::call_count_lt> *)local_1a8);
  rangeless::fn::operators::operator%
            (&local_a8,
             (vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
              *)&local_168,(concat *)local_188);
  paVar5 = local_70;
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             *)&local_168);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_148);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_e8);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_88);
  local_178 = local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  paVar12 = local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
            super__Vector_impl_data._M_finish;
  paVar7 = local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_188._0_8_ =
       local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_188._8_8_ =
       local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (paVar7 != paVar12) {
    lVar10 = (long)paVar12 - (long)paVar7 >> 7;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
                         *)local_1a8,
                        (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                         )paVar7,(lVar10 - (lVar10 + 1 >> 0x3f)) + 1 >> 1);
    if (local_198 == (aln_t *)0x0) {
      std::operator()((__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar7,(__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                                )paVar12,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )0x0);
    }
    else {
      std::operator()((__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar7,(__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                                )paVar12,local_198,local_1a8._8_8_,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_108);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
                *)local_1a8);
  }
  (paVar5->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_188._0_8_;
  (paVar5->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_188._8_8_;
  (paVar5->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_178;
  local_188._0_8_ = (long *)0x0;
  local_188._8_8_ = (pointer)0x0;
  local_178 = (pointer)0x0;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_188);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_a8);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_c8);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_128);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_68);
  return paVar5;
}

Assistant:

static auto filter_to_unique_cds_for_gene(alns_t alns_for_gene) -> alns_t
{
    return std::move(alns_for_gene)

    // (5.1) Keep alignments with valid cds-start.

  % fn::where L( _.chr_cds_start_pos != aln_t::invalid_pos )

    //-------------------------------------------------------------------
    // (5.2) Keep alignments with most-ubiquitous valid cds-starts.

  % my::group_all_by L( _.chr_cds_start_pos )
  % my::where_max_by L( _.size() )
  % fn::concat()

    //-------------------------------------------------------------------
    // Filter to unique chr_cds_start_pos.
    // (5.3) Prefer on "NC_*" chr-accession,
    // (5.4) then lower chr-id, 
    // (5.5) then more upstream cds-start.

  % my::where_min_by L( fn::tie_lvals( _.chr_id.first.find("NC_") != 0, 
                                       _.chr_id, 
                                       _.chr_cds_start_pos))

#if 1
    //-------------------------------------------------------------------
    // (6) Sort by decreasing alignment score, then by increasing mrna-id.

  % fn::sort_by L( fn::tie_lvals( fn::by::decreasing( _.score), _.mrna_id))

#else // alternatively, e.g if you want to use your own sort

  % [](alns_t alns)
    {
        gfx::timsort(
            alns.begin(), alns.end(), 
            fn::by::make_comp([](const aln_t& a)
            {
                return std::make_pair(
                   fn::by::decreasing( a.score),
                            std::cref( a.mrna_id));
            });
        return std::move(alns);
    }
#endif
    ; // end of return-statement
}